

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

NodeData * __thiscall c4::yml::Parser::_append_val(Parser *this,csubstr val,flag_t quoted)

{
  size_t sVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  csubstr tag;
  csubstr tag_00;
  Location loc;
  Location loc_00;
  Location loc_01;
  bool bVar5;
  error_flags eVar6;
  NodeData *pNVar7;
  Parser *this_00;
  size_t in_RDX;
  Parser *in_RDI;
  size_t nid;
  type_bits additional_flags;
  char msg_2 [49];
  char msg_1 [41];
  char msg [32];
  size_t in_stack_000001e0;
  undefined4 in_stack_000001e8;
  size_t child;
  State *in_stack_fffffffffffffd18;
  Parser *in_stack_fffffffffffffd20;
  pfn_allocate in_stack_fffffffffffffd28;
  Location *in_stack_fffffffffffffd30;
  pfn_error in_stack_fffffffffffffd38;
  Location *in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd68;
  char *i;
  char *i_00;
  Tree *in_stack_fffffffffffffd70;
  Tree *this_01;
  Tree *in_stack_fffffffffffffd78;
  pfn_error in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  pfn_error in_stack_fffffffffffffd90;
  char **in_stack_fffffffffffffd98;
  pfn_error in_stack_fffffffffffffda0;
  State *local_210;
  Parser *pPStack_208;
  pfn_allocate local_200;
  Location *pLStack_1f8;
  size_t local_1f0;
  undefined1 local_1e8 [56];
  State *local_1b0;
  Parser *pPStack_1a8;
  pfn_allocate local_1a0;
  Location *pLStack_198;
  pfn_error in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  Tree *in_stack_fffffffffffffe80;
  csubstr in_stack_fffffffffffffe88;
  State *local_150;
  Parser *pPStack_148;
  pfn_allocate local_140;
  Location *pLStack_138;
  pfn_error local_130;
  char *local_128;
  size_t local_120;
  size_t local_118;
  Tree *in_stack_fffffffffffffef0;
  State *local_80;
  Parser *pPStack_78;
  pfn_allocate local_70;
  Location *pLStack_68;
  State *local_58;
  Parser *pPStack_50;
  pfn_allocate local_48;
  Location *pLStack_40;
  
  bVar5 = has_all(in_RDI,0x200);
  if (bVar5) {
    local_128 = (char *)0x6166206b63656863;
    local_120._0_1_ = 'i';
    local_120._1_1_ = 'l';
    local_120._2_1_ = 'e';
    local_120._3_1_ = 'd';
    local_120._4_1_ = ':';
    local_120._5_1_ = ' ';
    local_120._6_1_ = '(';
    local_120._7_1_ = '!';
    local_118._0_1_ = ' ';
    local_118._1_1_ = 'h';
    local_118._2_1_ = 'a';
    local_118._3_1_ = 's';
    local_118._4_1_ = '_';
    local_118._5_1_ = 'a';
    local_118._6_1_ = 'l';
    local_118._7_1_ = 'l';
    in_stack_fffffffffffffef0 = (Tree *)0x29294c43535328;
    eVar6 = get_error_flags();
    if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      trap_instruction();
    }
    in_stack_fffffffffffffda0 = (in_RDI->m_stack).m_callbacks.m_error;
    in_stack_fffffffffffffd98 = &local_128;
    Location::Location(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
                       (size_t)in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
                       (size_t)in_stack_fffffffffffffd20);
    LVar2.super_LineCol.line = (size_t)pPStack_148;
    LVar2.super_LineCol.offset = (size_t)local_150;
    LVar2.super_LineCol.col = (size_t)local_140;
    LVar2.name.str = (char *)pLStack_138;
    LVar2.name.len = (size_t)local_130;
    (*in_stack_fffffffffffffda0)
              ((char *)in_stack_fffffffffffffd98,0x20,LVar2,
               (in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffd18 = local_150;
    in_stack_fffffffffffffd20 = pPStack_148;
    in_stack_fffffffffffffd28 = local_140;
    in_stack_fffffffffffffd30 = pLStack_138;
    in_stack_fffffffffffffd38 = local_130;
  }
  pNVar7 = node(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  if (pNVar7 == (NodeData *)0x0) {
    memcpy(&stack0xfffffffffffffe78,"check failed: (node(m_state) != nullptr)",0x29);
    eVar6 = get_error_flags();
    if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      trap_instruction();
    }
    in_stack_fffffffffffffd90 = (in_RDI->m_stack).m_callbacks.m_error;
    in_stack_fffffffffffffd88 = &stack0xfffffffffffffe78;
    Location::Location(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
                       (size_t)in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
                       (size_t)in_stack_fffffffffffffd20);
    in_stack_fffffffffffffd38 = in_stack_fffffffffffffe70;
    LVar3.super_LineCol.line = (size_t)pPStack_1a8;
    LVar3.super_LineCol.offset = (size_t)local_1b0;
    LVar3.super_LineCol.col = (size_t)local_1a0;
    LVar3.name.str = (char *)pLStack_198;
    LVar3.name.len = (size_t)in_stack_fffffffffffffd38;
    in_stack_fffffffffffffe70 = in_stack_fffffffffffffd38;
    (*in_stack_fffffffffffffd90)
              (in_stack_fffffffffffffd88,0x29,LVar3,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffd18 = local_1b0;
    in_stack_fffffffffffffd20 = pPStack_1a8;
    in_stack_fffffffffffffd28 = local_1a0;
    in_stack_fffffffffffffd30 = pLStack_198;
  }
  pNVar7 = Tree::_p(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  if (((pNVar7->m_type).type & SEQ) == NOTYPE) {
    memcpy(local_1e8,"check failed: (m_tree->is_seq(m_state->node_id))",0x31);
    eVar6 = get_error_flags();
    if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      trap_instruction();
    }
    in_stack_fffffffffffffd80 = (in_RDI->m_stack).m_callbacks.m_error;
    in_stack_fffffffffffffd78 = (Tree *)local_1e8;
    Location::Location(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
                       (size_t)in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
                       (size_t)in_stack_fffffffffffffd20);
    LVar4.super_LineCol.line = (size_t)pPStack_208;
    LVar4.super_LineCol.offset = (size_t)local_210;
    LVar4.super_LineCol.col = (size_t)local_200;
    LVar4.name.str = (char *)pLStack_1f8;
    LVar4.name.len = local_1f0;
    (*in_stack_fffffffffffffd80)
              ((char *)in_stack_fffffffffffffd78,0x31,LVar4,
               (in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffd18 = local_210;
    in_stack_fffffffffffffd20 = pPStack_208;
    in_stack_fffffffffffffd28 = local_200;
    in_stack_fffffffffffffd30 = pLStack_1f8;
  }
  this_01 = in_RDI->m_tree;
  i = (char *)in_RDI->m_state->node_id;
  pNVar7 = Tree::_p(in_stack_fffffffffffffd70,(size_t)i);
  sVar1 = pNVar7->m_last_child;
  i_00 = i;
  if (i == (char *)0xffffffffffffffff) {
    eVar6 = get_error_flags();
    if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
                       (size_t)in_stack_fffffffffffffd20,(size_t)in_stack_fffffffffffffd18);
    loc.super_LineCol.line = (size_t)in_stack_fffffffffffffd88;
    loc.super_LineCol.offset = (size_t)in_stack_fffffffffffffd80;
    loc.super_LineCol.col = (size_t)in_stack_fffffffffffffd90;
    loc.name.str = (char *)in_stack_fffffffffffffd98;
    loc.name.len = (size_t)in_stack_fffffffffffffda0;
    error<29ul>((char (*) [29])this_01,loc);
    in_stack_fffffffffffffd18 = local_58;
    in_stack_fffffffffffffd20 = pPStack_50;
    in_stack_fffffffffffffd28 = local_48;
    in_stack_fffffffffffffd30 = pLStack_40;
  }
  pNVar7 = Tree::_p(this_01,(size_t)i_00);
  if ((((pNVar7->m_type).type & (STREAM|MAP)) == NOTYPE) &&
     (bVar5 = Tree::is_root(this_01,(size_t)i_00), !bVar5)) {
    eVar6 = get_error_flags();
    if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
                       (size_t)in_stack_fffffffffffffd20,(size_t)in_stack_fffffffffffffd18);
    loc_00.super_LineCol.line = (size_t)in_stack_fffffffffffffd88;
    loc_00.super_LineCol.offset = (size_t)in_stack_fffffffffffffd80;
    loc_00.super_LineCol.col = (size_t)in_stack_fffffffffffffd90;
    loc_00.name.str = (char *)in_stack_fffffffffffffd98;
    loc_00.name.len = (size_t)in_stack_fffffffffffffda0;
    error<54ul>((char (*) [54])this_01,loc_00);
    in_stack_fffffffffffffd18 = local_80;
    in_stack_fffffffffffffd20 = pPStack_78;
    in_stack_fffffffffffffd28 = local_70;
    in_stack_fffffffffffffd30 = pLStack_68;
  }
  if ((sVar1 != 0xffffffffffffffff) &&
     (pNVar7 = Tree::_p(this_01,(size_t)i_00), (char *)pNVar7->m_parent != i)) {
    eVar6 = get_error_flags();
    if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
                       (size_t)in_stack_fffffffffffffd20,(size_t)in_stack_fffffffffffffd18);
    loc_01.super_LineCol.line = (size_t)in_stack_fffffffffffffd88;
    loc_01.super_LineCol.offset = (size_t)in_stack_fffffffffffffd80;
    loc_01.super_LineCol.col = (size_t)in_stack_fffffffffffffd90;
    loc_01.name.str = (char *)in_stack_fffffffffffffd98;
    loc_01.name.len = (size_t)in_stack_fffffffffffffda0;
    error<63ul>((char (*) [63])this_01,loc_01);
  }
  this_00 = (Parser *)Tree::_claim(in_stack_fffffffffffffef0);
  Tree::_set_hierarchy((Tree *)this,CONCAT44(quoted,in_stack_000001e8),in_stack_000001e0,msg._24_8_)
  ;
  Tree::to_val(in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78,in_stack_fffffffffffffe88
               ,(type_bits)in_stack_fffffffffffffe70);
  bVar5 = true;
  if ((in_RDI->m_val_tag).len != 0) {
    bVar5 = (in_RDI->m_val_tag).str == (char *)0x0;
  }
  if (!bVar5) {
    tag.len = (size_t)this_01;
    tag.str = i_00;
    normalize_tag(tag);
    tag_00.len = (size_t)in_stack_fffffffffffffd80;
    tag_00.str = (char *)in_stack_fffffffffffffd78;
    Tree::set_val_tag(this_01,(size_t)i_00,tag_00);
    basic_substring<const_char>::clear(&in_RDI->m_val_tag);
  }
  _write_val_anchor(this_00,in_RDX);
  pNVar7 = Tree::get(in_stack_fffffffffffffd78,(size_t)this_01);
  return pNVar7;
}

Assistant:

NodeData* Parser::_append_val(csubstr val, flag_t quoted)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks,  ! has_all(SSCL));
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_state) != nullptr);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_seq(m_state->node_id));
    type_bits additional_flags = quoted ? VALQUO : NOTYPE;
    _c4dbgpf("append val: '{}' to parent id={} (level={}){}", val, m_state->node_id, m_state->level, quoted ? " VALQUO!" : "");
    size_t nid = m_tree->append_child(m_state->node_id);
    m_tree->to_val(nid, val, additional_flags);

    _c4dbgpf("append val: id={} val='{}'", nid, m_tree->get(nid)->m_val.scalar);
    if( ! m_val_tag.empty())
    {
        _c4dbgpf("append val[{}]: set val tag='{}' -> '{}'", nid, m_val_tag, normalize_tag(m_val_tag));
        m_tree->set_val_tag(nid, normalize_tag(m_val_tag));
        m_val_tag.clear();
    }
    _write_val_anchor(nid);
    return m_tree->get(nid);
}